

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

bool helics::changeDetected
               (defV *prevValue,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val,
               double deltaV)

{
  pointer pcVar1;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  bVar4 = true;
  if ((prevValue->
      super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ).
      super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      ._M_index == '\x05') {
    pvVar2 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (prevValue);
    pcVar3 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pcVar1 - (long)pcVar3 ==
        (long)(pvVar2->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar2->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      if (pcVar1 == pcVar3) {
        bVar4 = false;
      }
      else {
        lVar6 = 8;
        uVar5 = 0;
        do {
          dVar7 = cabs(*(double *)
                        (((pvVar2->
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar6 + -8) -
                       *(double *)(pcVar3->_M_value + lVar6 + -8));
          bVar4 = deltaV < dVar7;
          if (deltaV < dVar7) {
            return bVar4;
          }
          uVar5 = uVar5 + 1;
          pcVar3 = (val->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x10;
        } while (uVar5 < (ulong)((long)(val->
                                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 >>
                                4));
      }
    }
  }
  return bVar4;
}

Assistant:

bool changeDetected(const defV& prevValue,
                    const std::vector<std::complex<double>>& val,
                    double deltaV)
{
    if (prevValue.index() == complex_vector_loc) {
        const auto& prevV = std::get<std::vector<std::complex<double>>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}